

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryGridRenderTests.cpp
# Opt level: O1

TestInstance * __thiscall
vkt::tessellation::anon_unknown_1::GridRenderTestCase::createInstance
          (GridRenderTestCase *this,Context *context)

{
  Flags FVar1;
  int iVar2;
  TestInstance *pTVar3;
  
  FVar1 = this->m_flags;
  iVar2 = this->m_numLayers;
  pTVar3 = (TestInstance *)operator_new(0x18);
  pTVar3->m_context = context;
  pTVar3->_vptr_TestInstance = (_func_int **)&PTR__TestInstance_00d2f808;
  pTVar3[1]._vptr_TestInstance = (_func_int **)CONCAT44(iVar2,FVar1);
  return pTVar3;
}

Assistant:

TestInstance* GridRenderTestCase::createInstance (Context& context) const
{
	GridRenderTestInstance::Params params;

	params.flags	 = m_flags;
	params.numLayers = m_numLayers;

	return new GridRenderTestInstance(context, params);
}